

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O3

wchar_t valid_options_item(menu_conflict *menu,wchar_t oid)

{
  wchar_t wVar1;
  
  wVar1 = L'\x01';
  if ((0xe < (uint)oid) && (wVar1 = L'\0', oid != L'\x0f')) {
    wVar1 = (wchar_t)((long)oid - 0x10U < 3);
  }
  return wVar1;
}

Assistant:

static int valid_options_item(struct menu *menu, int oid)
{
	size_t line = (size_t) oid;

	if (line < N_ELEMENTS(sval_dependent))
		return 1;

	/* Separator - blank line. */
	if (line == N_ELEMENTS(sval_dependent))
		return 0;

	line = line - N_ELEMENTS(sval_dependent) - 1;

	if (line < N_ELEMENTS(extra_item_options))
		return 1;

	return 0;
}